

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.h
# Opt level: O3

bool __thiscall llvm::yaml::isNumeric(yaml *this,StringRef S)

{
  yaml yVar1;
  char cVar2;
  void *pvVar3;
  char *pcVar4;
  size_type sVar5;
  size_t sVar6;
  char *pcVar7;
  yaml *pyVar8;
  StringRef SVar9;
  StringRef Input;
  StringRef Input_00;
  StringRef Input_01;
  StringRef local_30;
  
  pcVar4 = S.Data;
  if (pcVar4 == (char *)0x0) {
    return false;
  }
  if (pcVar4 == (char *)0x4) {
    if (*(int *)this == 0x6e616e2e) {
      return true;
    }
    if (*(int *)this == 0x4e614e2e) {
      return true;
    }
    if (*(int *)this == 0x4e414e2e) {
      return true;
    }
LAB_00d8c879:
    yVar1 = *this;
  }
  else {
    if (pcVar4 != (char *)0x1) goto LAB_00d8c879;
    yVar1 = *this;
    if (yVar1 == (yaml)0x2b) {
      return false;
    }
    if (yVar1 == (yaml)0x2d) {
      return false;
    }
  }
  if ((yVar1 == (yaml)0x2d) || (pyVar8 = this, pcVar7 = pcVar4, yVar1 == (yaml)0x2b)) {
    pyVar8 = this + 1;
    pcVar7 = pcVar4 + -1;
  }
  if (pcVar7 == (char *)0x4) {
    if (*(int *)pyVar8 == 0x666e692e) {
      return true;
    }
    if (*(int *)pyVar8 == 0x666e492e) {
      return true;
    }
    if (*(int *)pyVar8 == 0x464e492e) {
      return true;
    }
  }
  if (pcVar4 == (char *)0x1) {
LAB_00d8c8e0:
    if (pcVar7 != (char *)0x0) {
      yVar1 = *pyVar8;
      if (yVar1 == (yaml)0x65) {
        return false;
      }
      if (yVar1 == (yaml)0x45) {
        return false;
      }
      if (yVar1 == (yaml)0x2e) {
        if (pcVar7 == (char *)0x1) {
          return false;
        }
        pvVar3 = memchr("0123456789",(int)(char)pyVar8[1],0xb);
        if (pvVar3 == (void *)0x0) {
          return false;
        }
      }
    }
    Input.Length = (size_t)pcVar7;
    Input.Data = (char *)pyVar8;
    SVar9 = isNumeric::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&isNumeric(llvm::StringRef)::skipDigits,Input);
    if (SVar9.Length == 0) {
      return true;
    }
    cVar2 = *SVar9.Data;
    if ((cVar2 != 'e') && (cVar2 != 'E')) {
      if (cVar2 != '.') {
        return false;
      }
      Input_00.Length = SVar9.Length - 1;
      Input_00.Data = SVar9.Data + 1;
      SVar9 = isNumeric::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&isNumeric(llvm::StringRef)::skipDigits,Input_00
                        );
      if (SVar9.Length == 0) {
        return true;
      }
      if ((byte)(*SVar9.Data | 0x20U) != 0x65) {
        return false;
      }
    }
    pcVar4 = SVar9.Data;
    sVar6 = SVar9.Length - 1;
    if (sVar6 == 0) {
      return false;
    }
    if ((pcVar4[1] == '-') || (pcVar4[1] == '+')) {
      sVar6 = SVar9.Length - 2;
      if (sVar6 == 0) {
        return false;
      }
      pcVar4 = pcVar4 + 2;
    }
    else {
      pcVar4 = pcVar4 + 1;
    }
    Input_01.Length = sVar6;
    Input_01.Data = pcVar4;
    SVar9 = isNumeric::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&isNumeric(llvm::StringRef)::skipDigits,Input_01);
    return SVar9.Length == 0;
  }
  if (*(short *)this == 0x6f30) {
    if (pcVar4 < (char *)0x3) {
      return false;
    }
    pcVar7 = "01234567";
    sVar6 = 8;
  }
  else {
    if (*(short *)this != 0x7830) goto LAB_00d8c8e0;
    if (pcVar4 < (char *)0x3) {
      return false;
    }
    pcVar7 = "0123456789abcdefABCDEF";
    sVar6 = 0x16;
  }
  local_30.Length = (size_t)(pcVar4 + -2);
  local_30.Data = (char *)(this + 2);
  SVar9.Length = sVar6;
  SVar9.Data = pcVar7;
  sVar5 = StringRef::find_first_not_of(&local_30,SVar9,0);
  return sVar5 == 0xffffffffffffffff;
}

Assistant:

inline bool isNumeric(StringRef S) {
  const static auto skipDigits = [](StringRef Input) {
    return Input.drop_front(
        std::min(Input.find_first_not_of("0123456789"), Input.size()));
  };

  // Make S.front() and S.drop_front().front() (if S.front() is [+-]) calls
  // safe.
  if (S.empty() || S.equals("+") || S.equals("-"))
    return false;

  if (S.equals(".nan") || S.equals(".NaN") || S.equals(".NAN"))
    return true;

  // Infinity and decimal numbers can be prefixed with sign.
  StringRef Tail = (S.front() == '-' || S.front() == '+') ? S.drop_front() : S;

  // Check for infinity first, because checking for hex and oct numbers is more
  // expensive.
  if (Tail.equals(".inf") || Tail.equals(".Inf") || Tail.equals(".INF"))
    return true;

  // Section 10.3.2 Tag Resolution
  // YAML 1.2 Specification prohibits Base 8 and Base 16 numbers prefixed with
  // [-+], so S should be used instead of Tail.
  if (S.startswith("0o"))
    return S.size() > 2 &&
           S.drop_front(2).find_first_not_of("01234567") == StringRef::npos;

  if (S.startswith("0x"))
    return S.size() > 2 && S.drop_front(2).find_first_not_of(
                               "0123456789abcdefABCDEF") == StringRef::npos;

  // Parse float: [-+]? (\. [0-9]+ | [0-9]+ (\. [0-9]* )?) ([eE] [-+]? [0-9]+)?
  S = Tail;

  // Handle cases when the number starts with '.' and hence needs at least one
  // digit after dot (as opposed by number which has digits before the dot), but
  // doesn't have one.
  if (S.startswith(".") &&
      (S.equals(".") ||
       (S.size() > 1 && std::strchr("0123456789", S[1]) == nullptr)))
    return false;

  if (S.startswith("E") || S.startswith("e"))
    return false;

  enum ParseState {
    Default,
    FoundDot,
    FoundExponent,
  };
  ParseState State = Default;

  S = skipDigits(S);

  // Accept decimal integer.
  if (S.empty())
    return true;

  if (S.front() == '.') {
    State = FoundDot;
    S = S.drop_front();
  } else if (S.front() == 'e' || S.front() == 'E') {
    State = FoundExponent;
    S = S.drop_front();
  } else {
    return false;
  }

  if (State == FoundDot) {
    S = skipDigits(S);
    if (S.empty())
      return true;

    if (S.front() == 'e' || S.front() == 'E') {
      State = FoundExponent;
      S = S.drop_front();
    } else {
      return false;
    }
  }

  assert(State == FoundExponent && "Should have found exponent at this point.");
  if (S.empty())
    return false;

  if (S.front() == '+' || S.front() == '-') {
    S = S.drop_front();
    if (S.empty())
      return false;
  }

  return skipDigits(S).empty();
}